

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O3

StrScanFmt
strscan_hex(uint8_t *p,TValue *o,StrScanFmt fmt,uint32_t opt,int32_t ex2,int32_t neg,uint32_t dig)

{
  int32_t ex2_00;
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t uVar5;
  int iVar6;
  byte bVar7;
  
  if (dig == 0) {
    uVar2 = 0;
  }
  else {
    uVar5 = 0x10;
    if (dig < 0x10) {
      uVar5 = dig;
    }
    uVar2 = 0;
    do {
      bVar7 = *p;
      if (bVar7 == 0x2e) {
        bVar7 = p[1];
        p = p + 1;
      }
      uVar1 = bVar7 + 9;
      if (bVar7 < 0x3a) {
        uVar1 = (uint)bVar7;
      }
      uVar2 = (ulong)(uVar1 & 0xf) | uVar2 << 4;
      p = p + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    if (0x10 < dig) {
      iVar6 = dig - 0x10;
      do {
        bVar7 = *p;
        if (bVar7 == 0x2e) {
          bVar7 = p[1];
          p = p + 1;
        }
        uVar2 = uVar2 | bVar7 != 0x30;
        p = p + 1;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      ex2 = ex2 + dig * 4 + -0x40;
    }
  }
  if (fmt - STRSCAN_I64 < 2) {
    if (dig < 0x11) {
      uVar4 = -uVar2;
      if (neg == 0) {
        uVar4 = uVar2;
      }
      o->u64 = uVar4;
      return fmt;
    }
  }
  else {
    uVar1 = (uint)uVar2;
    if (fmt != STRSCAN_U32) {
      if (fmt != STRSCAN_INT) {
LAB_0011b99c:
        uVar4 = (ulong)(uVar1 & 3) | uVar2 >> 2;
        ex2_00 = ex2 + 2;
        if (uVar2 >> 0x3e == 0) {
          uVar4 = uVar2;
          ex2_00 = ex2;
        }
        strscan_double(uVar4,o,ex2_00,neg);
        return fmt;
      }
      if ((((opt & 2) == 0) && (uVar2 < (neg | 0x80000000))) && ((neg == 0 || (uVar2 != 0)))) {
        uVar3 = -uVar1;
        if (neg == 0) {
          uVar3 = uVar1;
        }
        (o->u32).lo = uVar3;
        return STRSCAN_INT;
      }
      fmt = STRSCAN_NUM;
      if ((opt & 0x10) == 0) goto LAB_0011b99c;
    }
    if (dig < 9) {
      uVar3 = -uVar1;
      if (neg == 0) {
        uVar3 = uVar1;
      }
      (o->u32).lo = uVar3;
      return STRSCAN_U32;
    }
  }
  return STRSCAN_ERROR;
}

Assistant:

static StrScanFmt strscan_hex(const uint8_t *p, TValue *o,
			      StrScanFmt fmt, uint32_t opt,
			      int32_t ex2, int32_t neg, uint32_t dig)
{
  uint64_t x = 0;
  uint32_t i;

  /* Scan hex digits. */
  for (i = dig > 16 ? 16 : dig ; i; i--, p++) {
    uint32_t d = (*p != '.' ? *p : *++p); if (d > '9') d += 9;
    x = (x << 4) + (d & 15);
  }

  /* Summarize rounding-effect of excess digits. */
  for (i = 16; i < dig; i++, p++)
    x |= ((*p != '.' ? *p : *++p) != '0'), ex2 += 4;

  /* Format-specific handling. */
  switch (fmt) {
  case STRSCAN_INT:
    if (!(opt & STRSCAN_OPT_TONUM) && x < 0x80000000u+neg &&
	!(x == 0 && neg)) {
      o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
      return STRSCAN_INT;  /* Fast path for 32 bit integers. */
    }
    if (!(opt & STRSCAN_OPT_C)) { fmt = STRSCAN_NUM; break; }
    /* fallthrough */
  case STRSCAN_U32:
    if (dig > 8) return STRSCAN_ERROR;
    o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
    return STRSCAN_U32;
  case STRSCAN_I64:
  case STRSCAN_U64:
    if (dig > 16) return STRSCAN_ERROR;
    o->u64 = neg ? ~x+1u : x;
    return fmt;
  default:
    break;
  }

  /* Reduce range, then convert to double. */
  if ((x & U64x(c0000000,0000000))) { x = (x >> 2) | (x & 3); ex2 += 2; }
  strscan_double(x, o, ex2, neg);
  return fmt;
}